

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O1

bool tao::pegtl::internal::
     string<(char)99,(char)111,(char)109,(char)112,(char)97,(char)99,(char)116>::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  int *piVar3;
  
  piVar3 = (int *)(in->
                  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).
                  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_current.data;
  if (6 < (ulong)((long)(in->
                        super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).
                        super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_end - (long)piVar3)) {
    if (*(int *)((long)piVar3 + 3) == 0x74636170 && *piVar3 == 0x706d6f63) {
      piVar1 = &(in->
                super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_current;
      piVar1->data = piVar1->data + 7;
      psVar2 = &(in->
                super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_current.byte;
      *psVar2 = *psVar2 + 7;
      psVar2 = &(in->
                super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_current.byte_in_line;
      *psVar2 = *psVar2 + 7;
      return true;
    }
  }
  return false;
}

Assistant:

const char* current() const noexcept
            {
               return m_current.data;
            }